

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86::forward_int8_x86
          (InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  undefined6 uVar8;
  undefined4 uVar9;
  undefined6 uVar10;
  undefined1 auVar11 [16];
  undefined1 uVar12;
  undefined1 uVar13;
  float *pfVar14;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  short sVar15;
  short sVar17;
  undefined1 auVar16 [16];
  float scale_in;
  int p_2;
  Mat scale_data;
  int *outptr_1;
  char w;
  char val;
  int i_1;
  char *sptr_1;
  char *kptr_1;
  int sum;
  int p_1;
  int *outptr;
  __m128i _s1;
  __m128i _s0;
  __m128i _sh;
  __m128i _sl;
  __m128i _w;
  __m128i _val;
  int i;
  char *sptr;
  char *kptr;
  __m128i _sum1;
  __m128i _sum0;
  int p;
  Mat top_blob_int32;
  int out_elempack;
  Option opt_flatten;
  Mat bottom_blob_int8_flattened;
  Option opt_q;
  Mat bottom_blob_int8;
  int elembits;
  Option opt_unpack;
  Mat bottom_blob_unpacked;
  int num_input;
  Mat *in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  undefined8 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  float fVar18;
  undefined8 in_stack_fffffffffffff968;
  int iVar19;
  Mat *in_stack_fffffffffffff970;
  Option *in_stack_fffffffffffff978;
  undefined8 in_stack_fffffffffffff980;
  int iVar20;
  Mat *in_stack_fffffffffffff988;
  Mat *in_stack_fffffffffffff990;
  undefined8 local_618;
  undefined8 uStack_610;
  Option *in_stack_fffffffffffffa48;
  Mat *in_stack_fffffffffffffa50;
  Mat *in_stack_fffffffffffffa58;
  undefined6 in_stack_fffffffffffffa60;
  undefined2 in_stack_fffffffffffffa66;
  Option *in_stack_fffffffffffffa90;
  Mat *in_stack_fffffffffffffa98;
  Mat *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  undefined2 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  float local_538;
  int local_534;
  Mat local_530;
  int *local_4e8;
  char local_4de;
  char local_4dd;
  int local_4dc;
  char *local_4d8;
  char *local_4d0;
  int local_4c8;
  int local_4c4;
  int *local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  Option *in_stack_fffffffffffffb78;
  Mat *in_stack_fffffffffffffb80;
  Mat *in_stack_fffffffffffffb88;
  InnerProduct *in_stack_fffffffffffffb90;
  int local_44c;
  char *local_448;
  long *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  int local_40c;
  Mat local_408;
  undefined4 local_3c0;
  int local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  Mat local_370;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e0 [40];
  int local_2b8;
  int local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  Mat local_240;
  int local_1f4;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  int local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  short local_18a;
  long local_188;
  undefined8 uStack_180;
  long *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  long local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  int *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  short local_10;
  short local_e;
  short local_c;
  short local_a;
  short local_8;
  short local_6;
  short local_4;
  short local_2;
  
  iVar19 = (int)((ulong)in_stack_fffffffffffff968 >> 0x20);
  iVar20 = (int)((ulong)in_stack_fffffffffffff980 >> 0x20);
  local_1f4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  local_1f0 = in_RCX;
  if (((in_RSI->dims == 2) && (in_RSI->w == local_1f4)) && (1 < in_RSI->h * in_RSI->elempack)) {
    ncnn::Mat::Mat(&local_240);
    local_288 = *local_1f0;
    local_278 = local_1f0[2];
    uStack_270 = local_1f0[3];
    local_268 = local_1f0[4];
    uStack_260 = local_1f0[5];
    local_258 = local_1f0[6];
    uStack_250 = local_1f0[7];
    uStack_280 = local_1f0[2];
    convert_packing(in_stack_fffffffffffff990,in_stack_fffffffffffff988,iVar20,
                    in_stack_fffffffffffff978);
    local_1cc = InnerProduct::forward_int8
                          (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                           in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    ncnn::Mat::~Mat((Mat *)0x3b4d6c);
  }
  else {
    local_1e8 = in_RDX;
    local_298 = ncnn::Mat::elembits(in_RSI);
    ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   in_stack_fffffffffffff948);
    local_40c = in_stack_fffffffffffffaac;
    if (local_298 != 8) {
      local_328 = *local_1f0;
      local_318 = *(undefined4 *)(local_1f0 + 2);
      uStack_314 = *(undefined4 *)((long)local_1f0 + 0x14);
      uStack_310 = *(undefined4 *)(local_1f0 + 3);
      uStack_30c = *(undefined4 *)((long)local_1f0 + 0x1c);
      local_308 = local_1f0[4];
      uStack_300 = local_1f0[5];
      local_2f8 = local_1f0[6];
      uStack_2f0 = local_1f0[7];
      uStack_320 = local_1f0[2];
      quantize_to_int8((Mat *)CONCAT26(in_stack_fffffffffffffa66,in_stack_fffffffffffffa60),
                       in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48
                      );
      local_40c = in_stack_fffffffffffffaac;
    }
    ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   in_stack_fffffffffffff948);
    if (local_2b8 != 1) {
      local_3b8 = *local_1f0;
      local_3a8 = local_1f0[2];
      uStack_3a0 = local_1f0[3];
      local_398 = local_1f0[4];
      uStack_390 = local_1f0[5];
      local_388 = local_1f0[6];
      uStack_380 = local_1f0[7];
      uStack_3b0 = local_1f0[2];
      (**(code **)(*(long *)in_RDI[1] + 0x38))((long *)in_RDI[1],local_2e0,&local_370,&local_3b8);
    }
    local_3bc = 1;
    if (((*(byte *)((long)local_1f0 + 0x27) & 1) != 0) &&
       (local_3bc = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0)) {
      local_3bc = 8;
    }
    ncnn::Mat::create(in_stack_fffffffffffff970,iVar19,
                      CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                      (int)((ulong)in_stack_fffffffffffff958 >> 0x20),
                      (Allocator *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    uVar12 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    if ((bool)uVar12) {
      local_1cc = -100;
      local_3c0 = 1;
    }
    else {
      ncnn::Mat::Mat(&local_408);
      ncnn::Mat::create(in_stack_fffffffffffff970,iVar19,
                        CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                        (int)((ulong)in_stack_fffffffffffff958 >> 0x20),
                        (Allocator *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      uVar13 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950)
                               );
      if ((bool)uVar13) {
        local_1cc = -100;
        local_3c0 = 1;
      }
      else {
        if (local_3bc == 8) {
          for (local_40c = 0;
              local_40c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) / local_3bc;
              local_40c = local_40c + 1) {
            local_1a8 = 0;
            uStack_1a0 = 0;
            in_stack_fffffffffffffa98 = (Mat *)0x0;
            in_stack_fffffffffffffaa0 = (Mat *)0x0;
            local_428 = 0;
            uStack_420 = 0;
            local_1b8 = 0;
            uStack_1b0 = 0;
            in_stack_fffffffffffffa90 = (Option *)0x0;
            local_438 = 0;
            uStack_430 = 0;
            local_440 = (long *)ncnn::Mat::row<signed_char_const>((Mat *)(in_RDI + 0x15),local_40c);
            local_448 = ncnn::Mat::operator_cast_to_signed_char_(&local_370);
            for (local_44c = 0; local_44c < local_1f4; local_44c = local_44c + 1) {
              local_18a = (short)*local_448;
              local_118 = CONCAT26(local_18a,CONCAT24(local_18a,CONCAT22(local_18a,local_18a)));
              uStack_110 = CONCAT26(local_18a,CONCAT24(local_18a,CONCAT22(local_18a,local_18a)));
              local_170 = local_440;
              local_188 = *local_440;
              uStack_180 = 0;
              local_1c8 = 0;
              uStack_1c0 = 0;
              local_138 = 0;
              uStack_130 = 0;
              uStack_140 = 0;
              local_148._0_1_ = (char)local_188;
              local_148._1_1_ = (char)((ulong)local_188 >> 8);
              local_148._2_1_ = (char)((ulong)local_188 >> 0x10);
              local_148._3_1_ = (char)((ulong)local_188 >> 0x18);
              local_148._4_1_ = (char)((ulong)local_188 >> 0x20);
              local_148._5_1_ = (char)((ulong)local_188 >> 0x28);
              local_148._6_1_ = (char)((ulong)local_188 >> 0x30);
              local_148._7_1_ = (undefined1)((ulong)local_188 >> 0x38);
              local_168 = CONCAT17(-(local_188 < 0),
                                   CONCAT16(-(local_148._6_1_ < '\0'),
                                            CONCAT15(-(local_148._5_1_ < '\0'),
                                                     CONCAT14(-(local_148._4_1_ < '\0'),
                                                              CONCAT13(-(local_148._3_1_ < '\0'),
                                                                       CONCAT12(-(local_148._2_1_ <
                                                                                 '\0'),CONCAT11(-(
                                                  local_148._1_1_ < '\0'),-((char)local_148 < '\0'))
                                                  ))))));
              uStack_160 = 0;
              uStack_150 = 0;
              sVar15 = CONCAT11(-((char)local_148 < '\0'),(char)local_148);
              uVar7 = CONCAT13(-(local_148._1_1_ < '\0'),CONCAT12(local_148._1_1_,sVar15));
              uVar8 = CONCAT15(-(local_148._2_1_ < '\0'),CONCAT14(local_148._2_1_,uVar7));
              local_108 = CONCAT17(-(local_148._3_1_ < '\0'),CONCAT16(local_148._3_1_,uVar8));
              sVar17 = CONCAT11(-(local_148._4_1_ < '\0'),local_148._4_1_);
              uVar9 = CONCAT13(-(local_148._5_1_ < '\0'),CONCAT12(local_148._5_1_,sVar17));
              uVar10 = CONCAT15(-(local_148._6_1_ < '\0'),CONCAT14(local_148._6_1_,uVar9));
              uStack_100 = CONCAT17(-(local_188 < 0),CONCAT16(local_148._7_1_,uVar10));
              local_128._2_2_ = (short)((uint)uVar7 >> 0x10);
              local_128._4_2_ = (short)((uint6)uVar8 >> 0x20);
              local_128._6_2_ = (short)((ulong)local_108 >> 0x30);
              uStack_120._2_2_ = (short)((uint)uVar9 >> 0x10);
              uStack_120._4_2_ = (short)((uint6)uVar10 >> 0x20);
              uStack_120._6_2_ = (short)((ulong)uStack_100 >> 0x30);
              sVar15 = local_18a * sVar15;
              sVar17 = local_18a * sVar17;
              local_d8 = CONCAT26(local_18a * local_128._6_2_,
                                  CONCAT24(local_18a * local_128._4_2_,
                                           CONCAT22(local_18a * local_128._2_2_,sVar15)));
              uStack_d0 = CONCAT26(local_18a * uStack_120._6_2_,
                                   CONCAT24(local_18a * uStack_120._4_2_,
                                            CONCAT22(local_18a * uStack_120._2_2_,sVar17)));
              auVar11._8_8_ = uStack_110;
              auVar11._0_8_ = local_118;
              auVar16._8_8_ = uStack_100;
              auVar16._0_8_ = local_108;
              auVar16 = pmulhw(auVar11,auVar16);
              local_618 = auVar16._0_8_;
              local_498 = local_618;
              uStack_610 = auVar16._8_8_;
              uStack_490 = uStack_610;
              uStack_e0 = uStack_610;
              local_e8._0_2_ = auVar16._0_2_;
              local_e8._2_2_ = auVar16._2_2_;
              local_e8._4_2_ = auVar16._4_2_;
              local_e8._6_2_ = auVar16._6_2_;
              iVar5 = CONCAT22((undefined2)local_e8,sVar15);
              local_4a8 = CONCAT26(local_e8._2_2_,CONCAT24(local_18a * local_128._2_2_,iVar5));
              iVar6 = CONCAT22(local_e8._4_2_,local_18a * local_128._4_2_);
              uStack_4a0 = CONCAT26(local_e8._6_2_,CONCAT24(local_18a * local_128._6_2_,iVar6));
              local_c8 = local_618;
              uStack_c0._0_2_ = auVar16._8_2_;
              uStack_c0._2_2_ = auVar16._10_2_;
              uStack_c0._4_2_ = auVar16._12_2_;
              uStack_c0._6_2_ = auVar16._14_2_;
              iVar19 = CONCAT22((undefined2)uStack_c0,sVar17);
              local_4b8 = CONCAT26(uStack_c0._2_2_,CONCAT24(local_18a * uStack_120._2_2_,iVar19));
              iVar20 = CONCAT22(uStack_c0._4_2_,local_18a * uStack_120._4_2_);
              uStack_4b0 = CONCAT26(uStack_c0._6_2_,CONCAT24(local_18a * uStack_120._6_2_,iVar20));
              uVar1 = local_428;
              uVar2 = uStack_420;
              local_78._0_4_ = (int)local_428;
              local_78._4_4_ = (int)((ulong)local_428 >> 0x20);
              uStack_70._0_4_ = (int)uStack_420;
              uStack_70._4_4_ = (int)((ulong)uStack_420 >> 0x20);
              local_88._4_4_ = (int)((ulong)local_4a8 >> 0x20);
              uStack_80._4_4_ = (int)((ulong)uStack_4a0 >> 0x20);
              local_428 = CONCAT44(local_78._4_4_ + local_88._4_4_,(int)local_78 + iVar5);
              uStack_420 = CONCAT44(uStack_70._4_4_ + uStack_80._4_4_,(int)uStack_70 + iVar6);
              uVar3 = local_438;
              uVar4 = uStack_430;
              local_98._0_4_ = (int)local_438;
              local_98._4_4_ = (int)((ulong)local_438 >> 0x20);
              uStack_90._0_4_ = (int)uStack_430;
              uStack_90._4_4_ = (int)((ulong)uStack_430 >> 0x20);
              local_a8._4_4_ = (int)((ulong)local_4b8 >> 0x20);
              uStack_a0._4_4_ = (int)((ulong)uStack_4b0 >> 0x20);
              local_438 = CONCAT44(local_98._4_4_ + local_a8._4_4_,(int)local_98 + iVar19);
              uStack_430 = CONCAT44(uStack_90._4_4_ + uStack_a0._4_4_,(int)uStack_90 + iVar20);
              local_448 = local_448 + 1;
              local_440 = local_440 + 1;
              local_158 = local_188;
              local_148 = local_188;
              local_128 = local_108;
              uStack_120 = uStack_100;
              local_f8 = local_118;
              uStack_f0 = uStack_110;
              local_e8 = local_618;
              uStack_c0 = uStack_610;
              local_b8 = local_d8;
              uStack_b0 = uStack_d0;
              local_a8 = local_4b8;
              uStack_a0 = uStack_4b0;
              local_98 = uVar3;
              uStack_90 = uVar4;
              local_88 = local_4a8;
              uStack_80 = uStack_4a0;
              local_78 = uVar1;
              uStack_70 = uVar2;
              local_28 = local_118;
              uStack_20 = uStack_110;
              local_10 = local_18a;
              local_e = local_18a;
              local_c = local_18a;
              local_a = local_18a;
              local_8 = local_18a;
              local_6 = local_18a;
              local_4 = local_18a;
              local_2 = local_18a;
            }
            local_4c0 = ncnn::Mat::operator_cast_to_int_(&local_408);
            local_30 = local_4c0 + (local_40c << 3);
            local_48 = local_428;
            uStack_40 = uStack_420;
            *(undefined8 *)local_30 = local_428;
            *(undefined8 *)(local_30 + 2) = uStack_420;
            local_50 = local_4c0 + (long)(local_40c << 3) + 4;
            local_68 = local_438;
            uStack_60 = uStack_430;
            *(undefined8 *)local_50 = local_438;
            *(undefined8 *)(local_4c0 + (long)(local_40c << 3) + 6) = uStack_430;
          }
        }
        iVar19 = (int)((ulong)in_stack_fffffffffffff958 >> 0x20);
        if (local_3bc == 1) {
          for (local_4c4 = 0; iVar19 = (int)((ulong)in_stack_fffffffffffff958 >> 0x20),
              local_4c4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) / local_3bc;
              local_4c4 = local_4c4 + 1) {
            local_4c8 = 0;
            local_4d0 = ncnn::Mat::row<signed_char_const>((Mat *)(in_RDI + 0x15),local_4c4);
            local_4d8 = ncnn::Mat::operator_cast_to_signed_char_(&local_370);
            for (local_4dc = 0; local_4dc < local_1f4; local_4dc = local_4dc + 1) {
              local_4dd = *local_4d8;
              local_4de = *local_4d0;
              local_4c8 = (int)local_4dd * (int)local_4de + local_4c8;
              local_4d8 = local_4d8 + 1;
              local_4d0 = local_4d0 + 1;
            }
            local_4e8 = ncnn::Mat::operator_cast_to_int_(&local_408);
            local_4e8[local_4c4] = local_4c8;
          }
        }
        ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),iVar19,
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       (Allocator *)in_stack_fffffffffffff948);
        for (local_534 = 0; local_534 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_534 = local_534 + 1) {
          pfVar14 = ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0),
                               (long)local_534);
          if ((*pfVar14 != 0.0) || (NAN(*pfVar14))) {
            pfVar14 = ncnn::Mat::operator[]
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x208),0);
            fVar18 = *pfVar14;
            pfVar14 = ncnn::Mat::operator[]
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0),
                                 (long)local_534);
            local_538 = 1.0 / (fVar18 * *pfVar14);
          }
          else {
            local_538 = 0.0;
          }
          pfVar14 = ncnn::Mat::operator[](&local_530,(long)local_534);
          *pfVar14 = local_538;
        }
        dequantize_from_int32
                  ((Mat *)CONCAT44(in_stack_fffffffffffffab4,
                                   CONCAT13(uVar12,CONCAT12(uVar13,in_stack_fffffffffffffab0))),
                   (Mat *)CONCAT44(local_40c,in_stack_fffffffffffffaa8),in_stack_fffffffffffffaa0,
                   in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
        if (in_RDI[2] != 0) {
          (**(code **)(*(long *)in_RDI[2] + 0x48))((long *)in_RDI[2],local_1e8,local_1f0);
        }
        local_1cc = 0;
        local_3c0 = 1;
        ncnn::Mat::~Mat((Mat *)0x3b5a93);
      }
      ncnn::Mat::~Mat((Mat *)0x3b5aa0);
    }
    ncnn::Mat::~Mat((Mat *)0x3b5abe);
    ncnn::Mat::~Mat((Mat *)0x3b5acb);
  }
  return local_1cc;
}

Assistant:

int InnerProduct_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        Mat bottom_blob_unpacked;
        Option opt_unpack = opt;
        opt_unpack.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_unpack);

        return forward_int8(bottom_blob_unpacked, top_blob, opt);
    }

    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    Mat bottom_blob_int8_flattened = bottom_blob_int8;
    if (bottom_blob_int8.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;
        flatten->forward(bottom_blob_int8, bottom_blob_int8_flattened, opt_flatten);
    }

    //     int elempack = bottom_blob_int8_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__
    //     size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat top_blob_int32;
    top_blob_int32.create(num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (out_elempack == 8)
    {
// num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < num_output / out_elempack; p++)
        {
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();

            const signed char* kptr = weight_data_int8.row<const signed char>(p);
            const signed char* sptr = bottom_blob_int8_flattened;

            int i = 0;
            for (; i < num_input; i++)
            {
                __m128i _val = _mm_set1_epi16((short)sptr[0]);

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                __m128i _sl = _mm_mullo_epi16(_val, _w);
                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                _sum0 = _mm_add_epi32(_sum0, _s0);
                _sum1 = _mm_add_epi32(_sum1, _s1);

                sptr += 1;
                kptr += 8;
            }

            int* outptr = (int*)top_blob_int32;
            _mm_storeu_si128((__m128i*)(outptr + p * 8), _sum0);
            _mm_storeu_si128((__m128i*)(outptr + p * 8 + 4), _sum1);
        }
    }
#endif // __SSE2__

    if (out_elempack == 1)
    {
// num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < num_output / out_elempack; p++)
        {
            int sum = 0;

            const signed char* kptr = weight_data_int8.row<const signed char>(p);
            const signed char* sptr = bottom_blob_int8_flattened;

            int i = 0;
            for (; i < num_input; i++)
            {
                signed char val = sptr[0];

                signed char w = kptr[0];

                sum += val * w;

                sptr += 1;
                kptr += 1;
            }

            int* outptr = (int*)top_blob_int32;
            outptr[p] = sum;
        }
    }

    Mat scale_data(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // dequantize
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_data[p] = scale_in;
    }

    dequantize_from_int32(top_blob_int32, top_blob, scale_data, bias_data, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}